

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Vec4 *reference,
               ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  void **this;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  TextureChannelClass TVar3;
  TextureFormat *pTVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  LogImage local_7c0;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  LogImageSet local_6e0;
  TextureFormat local_69c;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  LogImage local_648;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogImage local_568;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  LogImageSet local_488;
  MessageBuilder local_448;
  MessageBuilder local_2c8;
  Vector<bool,_4> local_145;
  byte local_141;
  undefined1 local_140 [7];
  bool compareOk;
  tcu local_130 [19];
  Vector<bool,_4> local_11d;
  byte local_119;
  undefined1 local_118 [7];
  bool isOk;
  undefined1 local_108 [8];
  Vec4 diff;
  Vec4 cmpPix;
  int x;
  int y;
  int z;
  Vec4 pixelScale;
  Vec4 pixelBias;
  Vec4 maxDiff;
  undefined1 local_a0 [8];
  PixelBufferAccess errorMask;
  undefined1 local_70 [8];
  TextureLevel errorMaskStorage;
  int depth;
  int height;
  int width;
  Vec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  Vec4 *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  width_00 = ConstPixelBufferAccess::getWidth(result);
  height_00 = ConstPixelBufferAccess::getHeight(result);
  errorMaskStorage.m_data.m_cap._4_4_ = ConstPixelBufferAccess::getDepth(result);
  this = &errorMask.super_ConstPixelBufferAccess.m_data;
  TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_70,(TextureFormat *)this,width_00,height_00,
             errorMaskStorage.m_data.m_cap._4_4_);
  TextureLevel::getAccess((PixelBufferAccess *)local_a0,(TextureLevel *)local_70);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelBias.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)&y,1.0,1.0,1.0,1.0);
  for (x = 0; x < errorMaskStorage.m_data.m_cap._4_4_; x = x + 1) {
    for (cmpPix.m_data[3] = 0.0; (int)cmpPix.m_data[3] < height_00;
        cmpPix.m_data[3] = (float)((int)cmpPix.m_data[3] + 1)) {
      for (cmpPix.m_data[2] = 0.0; (int)cmpPix.m_data[2] < width_00;
          cmpPix.m_data[2] = (float)((int)cmpPix.m_data[2] + 1)) {
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)(diff.m_data + 2),(int)result,(int)cmpPix.m_data[2],
                   (int)cmpPix.m_data[3]);
        operator-((tcu *)local_118,reference,(Vector<float,_4> *)(diff.m_data + 2));
        abs<float,4>((tcu *)local_108,(Vector<float,_4> *)local_118);
        lessThanEqual<float,4>((tcu *)&local_11d,(Vector<float,_4> *)local_108,threshold);
        local_119 = boolAll<4>(&local_11d);
        max<float,4>(local_130,(Vector<float,_4> *)(pixelBias.m_data + 2),
                     (Vector<float,_4> *)local_108);
        pixelBias.m_data._8_8_ = local_130._0_8_;
        if ((local_119 & 1) == 0) {
          Vector<float,_4>::Vector((Vector<float,_4> *)local_140,1.0,0.0,0.0,1.0);
        }
        else {
          Vector<float,_4>::Vector((Vector<float,_4> *)local_140,0.0,1.0,0.0,1.0);
        }
        PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_a0,(Vec4 *)local_140,(int)cmpPix.m_data[2],
                   (int)cmpPix.m_data[3],x);
      }
    }
  }
  lessThanEqual<float,4>((tcu *)&local_145,(Vector<float,_4> *)(pixelBias.m_data + 2),threshold);
  local_141 = boolAll<4>(&local_145);
  if (((bool)local_141) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar4 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_69c,RGBA,UNORM_INT8);
      bVar2 = TextureFormat::operator!=(pTVar4,&local_69c);
      if (bVar2) {
        computePixelScaleBias(result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,imageSetName,&local_701);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_728,imageSetDesc,&local_729);
      LogImageSet::LogImageSet(&local_6e0,&local_700,&local_728);
      pTVar6 = TestLog::operator<<(log,&local_6e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"Result",&local_7e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"Result",&local_809);
      LogImage::LogImage(&local_7c0,&local_7e0,&local_808,result,(Vec4 *)&y,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = TestLog::operator<<(pTVar6,&local_7c0);
      TestLog::operator<<(pTVar6,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_7c0);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator(&local_809);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::allocator<char>::~allocator(&local_7e1);
      LogImageSet::~LogImageSet(&local_6e0);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
    }
  }
  else {
    pTVar4 = ConstPixelBufferAccess::getFormat(result);
    TVar3 = getTextureChannelClass(pTVar4->type);
    if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      anon_unknown_47::computeScaleAndBias(result,result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2))
      ;
      TestLog::operator<<(&local_2c8,log,(BeginMessageToken *)&TestLog::Message);
      pMVar5 = MessageBuilder::operator<<
                         (&local_2c8,(char (*) [45])"Result image is normalized with formula p * ");
      pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)&y);
      pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [4])0xaeb957);
      pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)(pixelScale.m_data + 2));
      MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
      MessageBuilder::~MessageBuilder(&local_2c8);
    }
    if ((local_141 & 1) == 0) {
      TestLog::operator<<(&local_448,log,(BeginMessageToken *)&TestLog::Message);
      pMVar5 = MessageBuilder::operator<<
                         (&local_448,(char (*) [43])"Image comparison failed: max difference = ");
      pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)(pixelBias.m_data + 2));
      pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [15])0xb1636c);
      pMVar5 = MessageBuilder::operator<<(pMVar5,threshold);
      pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [15])", reference = ");
      pMVar5 = MessageBuilder::operator<<(pMVar5,reference);
      MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
      MessageBuilder::~MessageBuilder(&local_448);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,imageSetName,&local_4a9)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,imageSetDesc,&local_4d1)
    ;
    LogImageSet::LogImageSet(&local_488,&local_4a8,&local_4d0);
    pTVar6 = TestLog::operator<<(log,&local_488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"Result",&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"Result",&local_5b1);
    LogImage::LogImage(&local_568,&local_588,&local_5b0,result,(Vec4 *)&y,
                       (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = TestLog::operator<<(pTVar6,&local_568);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"ErrorMask",&local_669);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Error mask",&local_691)
    ;
    LogImage::LogImage(&local_648,&local_668,&local_690,(ConstPixelBufferAccess *)local_a0,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = TestLog::operator<<(pTVar6,&local_648);
    TestLog::operator<<(pTVar6,(EndImageSetToken *)&TestLog::EndImageSet);
    LogImage::~LogImage(&local_648);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator(&local_669);
    LogImage::~LogImage(&local_568);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    LogImageSet::~LogImageSet(&local_488);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
  }
  bVar1 = local_141;
  TextureLevel::~TextureLevel((TextureLevel *)local_70);
  return (bool)(bVar1 & 1);
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Vec4& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	const int			width				= result.getWidth();
	const int			height				= result.getHeight();
	const int			depth				= result.getDepth();

	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	cmpPix		= result.getPixel(x, y, z);
				const Vec4	diff		= abs(reference - cmpPix);
				const bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(result.getFormat().type) != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(result, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result image is normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << ", reference = " << reference << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}